

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator
          (ImmutableEnumOneofFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  
  ImmutableEnumFieldGenerator::ImmutableEnumFieldGenerator
            (&this->super_ImmutableEnumFieldGenerator,descriptor,messageBitIndex,builderBitIndex,
             context);
  (this->super_ImmutableEnumFieldGenerator).super_ImmutableFieldGenerator.
  _vptr_ImmutableFieldGenerator = (_func_int **)&PTR__ImmutableEnumOneofFieldGenerator_00424670;
  info = Context::GetOneofGeneratorInfo(context,*(OneofDescriptor **)(descriptor + 0x60));
  SetCommonOneofVariables(descriptor,info,&(this->super_ImmutableEnumFieldGenerator).variables_);
  return;
}

Assistant:

ImmutableEnumOneofFieldGenerator::
ImmutableEnumOneofFieldGenerator(const FieldDescriptor* descriptor,
                                 int messageBitIndex,
                                 int builderBitIndex,
                                 Context* context)
    : ImmutableEnumFieldGenerator(
          descriptor, messageBitIndex, builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}